

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_string.c
# Opt level: O3

void parse_string_should_parse_strings(void)

{
  assert_parse_string("\"\"","");
  assert_parse_string("\" !\\\"#$%&\'()*+,-./\\/0123456789:;<=>?@ABCDEFGHIJKLMNOPQRSTUVWXYZ[\\\\]^_\'abcdefghijklmnopqrstuvwxyz{|}~\""
                      ,
                      " !\"#$%&\'()*+,-.//0123456789:;<=>?@ABCDEFGHIJKLMNOPQRSTUVWXYZ[\\]^_\'abcdefghijklmnopqrstuvwxyz{|}~"
                     );
  assert_parse_string("\"\\\"\\\\\\/\\b\\f\\n\\r\\t\\u20AC\\u732b\"",anon_var_dwarf_412);
  reset(item);
  assert_parse_string("\"\b\f\n\r\t\"","\b\f\n\r\t");
  reset(item);
  return;
}

Assistant:

static void parse_string_should_parse_strings(void)
{
    assert_parse_string("\"\"", "");
    assert_parse_string(
        "\" !\\\"#$%&'()*+,-./\\/0123456789:;<=>?@ABCDEFGHIJKLMNOPQRSTUVWXYZ[\\\\]^_'abcdefghijklmnopqrstuvwxyz{|}~\"",
        " !\"#$%&'()*+,-.//0123456789:;<=>?@ABCDEFGHIJKLMNOPQRSTUVWXYZ[\\]^_'abcdefghijklmnopqrstuvwxyz{|}~");
    assert_parse_string(
        "\"\\\"\\\\\\/\\b\\f\\n\\r\\t\\u20AC\\u732b\"",
        "\"\\/\b\f\n\r\t€猫");
    reset(item);
    assert_parse_string("\"\b\f\n\r\t\"", "\b\f\n\r\t");
    reset(item);
}